

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.cpp
# Opt level: O0

char ncnn::float32_to_int8(float value)

{
  float tmp;
  float value_local;
  undefined1 local_1;
  
  if (value < 0.0) {
    tmp = value - 0.5;
  }
  else {
    tmp = value + 0.5;
  }
  if (tmp <= 127.0) {
    if (-128.0 <= tmp) {
      local_1 = (char)(int)tmp;
    }
    else {
      local_1 = -0x80;
    }
  }
  else {
    local_1 = '\x7f';
  }
  return local_1;
}

Assistant:

signed char float32_to_int8(float value)
{
    float tmp;
    if (value >= 0.f)
        tmp = value + 0.5f;
    else
        tmp = value - 0.5f;

    if (tmp > 127)
        return 127;
    if (tmp < -128)
        return -128;

    return static_cast<signed char>(tmp);
}